

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

monster_base * lookup_monster_base(char *name)

{
  int iVar1;
  monster_base **ppmVar2;
  
  ppmVar2 = &rb_info;
  do {
    ppmVar2 = &((monster_base *)ppmVar2)->next->next;
    if ((monster_base *)ppmVar2 == (monster_base *)0x0) {
      return (monster_base *)0x0;
    }
    iVar1 = strcmp(name,((monster_base *)ppmVar2)->name);
  } while (iVar1 != 0);
  return (monster_base *)ppmVar2;
}

Assistant:

struct monster_base *lookup_monster_base(const char *name)
{
	struct monster_base *base;

	/* Look for it */
	for (base = rb_info; base; base = base->next) {
		if (streq(name, base->name))
			return base;
	}

	return NULL;
}